

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::set_gc_using_line(Am_Drawonable_Impl *this,Am_Style *line,Am_Draw_Function f)

{
  int iVar1;
  Am_Wrapper *value;
  Am_Style_Data *this_00;
  Am_Style_Data *lin;
  unsigned_long fore_index;
  Am_Image_Array local_d8;
  Am_Image_Array stipple;
  Am_Fill_Solid_Flag local_c8;
  Am_Fill_Poly_Flag poly;
  Am_Fill_Solid_Flag fill_flag;
  int dash_l_length;
  char *dash_l;
  Am_Line_Solid_Flag line_flag;
  Am_Join_Style_Flag join;
  Am_Line_Cap_Style_Flag cap;
  short thickness;
  unsigned_long mask;
  XGCValues values;
  Am_Draw_Function f_local;
  Am_Style *line_local;
  Am_Drawonable_Impl *this_local;
  
  _cap = 0;
  values._124_4_ = f;
  Am_Image_Array::Am_Image_Array(&local_d8);
  Am_Style::Get_Values
            (line,(short *)((long)&join + 2),&line_flag,(Am_Join_Style_Flag *)((long)&dash_l + 4),
             (Am_Line_Solid_Flag *)&dash_l,(char **)&fill_flag,(int *)&poly,&local_c8,
             (Am_Fill_Poly_Flag *)((long)&stipple.data + 4),&local_d8);
  if (values._124_4_ == 7) {
    lin = (Am_Style_Data *)Am_Style_Data::Get_X_Index(&Am_On_Bits_Data,this);
  }
  else {
    value = Am_Style::operator_cast_to_Am_Wrapper_(line);
    this_00 = Am_Style_Data::Narrow(value);
    lin = (Am_Style_Data *)Am_Style_Data::Get_X_Index(this_00,this);
    if (this_00 != (Am_Style_Data *)0x0) {
      Am_Wrapper::Release(&this_00->super_Am_Wrapper);
    }
  }
  iVar1 = XGetGCValues(this->screen->display,this->screen->gc,Am_GC_getmask,&mask);
  if (iVar1 != 0) {
    adjust_gcvalues_color_drawfn
              (this,(XGCValues *)&mask,(unsigned_long *)&cap,(unsigned_long)lin,values._124_4_);
    adjust_gcvalues_thickness((XGCValues *)&mask,(unsigned_long *)&cap,join._2_2_);
    adjust_gcvalues_capstyle((XGCValues *)&mask,(unsigned_long *)&cap,line_flag);
    adjust_gcvalues_joinstyle((XGCValues *)&mask,(unsigned_long *)&cap,dash_l._4_4_);
    adjust_gcvalues_stipple(this,(XGCValues *)&mask,(unsigned_long *)&cap,local_c8,&local_d8);
    _cap = _cap | 0x20;
    if ((int)dash_l == 0) {
      values.background._4_4_ = 0;
    }
    else if ((int)dash_l == 1) {
      values.background._4_4_ = 1;
    }
    if (_cap != 0) {
      XChangeGC(this->screen->display,this->screen->gc,_cap,&mask);
    }
    if (poly != Am_FILL_POLY_EVEN_ODD) {
      XSetDashes(this->screen->display,this->screen->gc,0,_fill_flag,poly);
    }
    Am_Image_Array::~Am_Image_Array(&local_d8);
    return;
  }
  Am_Error("** set_gc_using_line: could not get GC values.\n");
}

Assistant:

void
Am_Drawonable_Impl::set_gc_using_line(const Am_Style &line,
                                      Am_Draw_Function f) const
{
  XGCValues values;
  unsigned long mask = 0;

  short thickness;
  Am_Line_Cap_Style_Flag cap;
  Am_Join_Style_Flag join;
  Am_Line_Solid_Flag line_flag;
  const char *dash_l;
  int dash_l_length;
  Am_Fill_Solid_Flag fill_flag;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array stipple;

  line.Get_Values(thickness, cap, join, line_flag, dash_l, dash_l_length,
                  fill_flag, poly, stipple);

  unsigned long fore_index;
  if (f != Am_DRAW_MASK_COPY) {
    //declare colors are Am_Style_Impls so can call Get_X_Index
    Am_Style_Data *lin = Am_Style_Data::Narrow(line);
    fore_index = lin->Get_X_Index(this);
    if (lin)
      lin->Release();
  } else
    fore_index = Am_On_Bits_Data.Get_X_Index(this);

  if (XGetGCValues(screen->display, screen->gc, Am_GC_getmask, &values) == 0)
    Am_Error("** set_gc_using_line: could not get GC values.\n");

  adjust_gcvalues_color_drawfn(values, mask, fore_index, f);
  adjust_gcvalues_thickness(values, mask, thickness);
  adjust_gcvalues_capstyle(values, mask, cap);
  adjust_gcvalues_joinstyle(values, mask, join);
  adjust_gcvalues_stipple(values, mask, fill_flag, stipple);

  // You can't query the GC about its current dash pattern, so you have
  // to set it every time.  Fix this by storing the old value in the
  // screen object, so you can compare (without relying on X functions).
  mask |= GCLineStyle;
  switch (line_flag) {
  case Am_LINE_SOLID:
    values.line_style = LineSolid;
    break;
  case Am_LINE_ON_OFF_DASH:
    values.line_style = LineOnOffDash;
    break;
    // not supported
    //     case Am_LINE_DOUBLE_DASH:
    //       values.line_style = LineDoubleDash;
    //       break;
  }

  if (mask) {
    XChangeGC(screen->display, screen->gc, mask, &values);
  }

  // XSetDashes call must be called after XChangeGC
  //
  if (dash_l_length)
    XSetDashes(screen->display, screen->gc, 0, dash_l, dash_l_length);
}